

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  _GLFWlibrary *p_Var1;
  undefined8 uVar2;
  GLFWbool GVar3;
  int iVar4;
  _GLFWwindow *window;
  _GLFWwindow *handle;
  long lVar5;
  anon_struct_200_4_80ee7fb7_for_hints *paVar6;
  _GLFWfbconfig *p_Var7;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/window.c"
                  ,0x84,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized == 0) {
    iVar4 = 0x10001;
  }
  else {
    if (width < 1 || height < 1) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
      return (GLFWwindow *)0x0;
    }
    p_Var1 = &_glfw;
    p_Var7 = &fbconfig;
    for (lVar5 = 9; paVar6 = &p_Var1->hints, lVar5 != 0; lVar5 = lVar5 + -1) {
      p_Var1 = (_GLFWlibrary *)&paVar6->framebuffer;
      iVar4 = (paVar6->framebuffer).greenBits;
      p_Var7->redBits = (paVar6->framebuffer).redBits;
      p_Var7->greenBits = iVar4;
      p_Var7 = (_GLFWfbconfig *)&p_Var7->blueBits;
    }
    ctxconfig._48_8_ = _glfw.hints.context._48_8_;
    ctxconfig._32_8_ = _glfw.hints.context._32_8_;
    ctxconfig._16_8_ = _glfw.hints.context._16_8_;
    ctxconfig._24_8_ = _glfw.hints.context._24_8_;
    ctxconfig._0_8_ = _glfw.hints.context._0_8_;
    uVar2 = ctxconfig._0_8_;
    ctxconfig._8_8_ = _glfw.hints.context._8_8_;
    wndconfig.nativeParent = _glfw.hints.window.nativeParent;
    wndconfig._24_8_ = _glfw.hints.window._24_8_;
    wndconfig._32_8_ = _glfw.hints.window._32_8_;
    wndconfig._40_8_ = _glfw.hints.window._40_8_;
    wndconfig._48_8_ = _glfw.hints.window._48_8_;
    wndconfig.ns = _glfw.hints.window.ns;
    wndconfig.height = height;
    wndconfig.width = width;
    wndconfig.title = title;
    ctxconfig._0_8_ = uVar2;
    ctxconfig.share = (_GLFWwindow *)share;
    if ((share == (GLFWwindow *)0x0) ||
       ((ctxconfig.client = _glfw.hints.context.client, ctxconfig.client != 0 &&
        (*(int *)(share + 0x1f0) != 0)))) {
      GVar3 = _glfwIsValidContextConfig(&ctxconfig);
      if (GVar3 != 0) {
        window = (_GLFWwindow *)calloc(1,0x368);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = fbconfig.redBits;
        (window->videoMode).greenBits = fbconfig.greenBits;
        (window->videoMode).blueBits = fbconfig.blueBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = (_GLFWmonitor *)monitor;
        window->resizable = wndconfig.resizable;
        window->decorated = wndconfig.decorated;
        window->autoIconify = wndconfig.autoIconify;
        window->floating = wndconfig.floating;
        window->cursorMode = 0x34001;
        window->minwidth = -1;
        window->minheight = -1;
        window->maxwidth = -1;
        window->maxheight = -1;
        window->numer = -1;
        window->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if (ctxconfig.client != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar4 = _glfwPlatformCreateWindow(window,&wndconfig,&ctxconfig,&fbconfig);
        if (iVar4 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
        }
        else {
          if (ctxconfig.client == 0) {
LAB_00116d3d:
            if (window->monitor != (_GLFWmonitor *)0x0) {
              return (GLFWwindow *)window;
            }
            if (wndconfig.visible == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformFocusWindow(window);
            return (GLFWwindow *)window;
          }
          (*(window->context).makeCurrent)(window);
          GVar3 = _glfwRefreshContextAttribs(&ctxconfig);
          glfwMakeContextCurrent((GLFWwindow *)handle);
          if (GVar3 != 0) goto LAB_00116d3d;
        }
        glfwDestroyWindow((GLFWwindow *)window);
      }
      return (GLFWwindow *)0x0;
    }
    iVar4 = 0x1000a;
  }
  _glfwInputError(iVar4,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}